

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O1

void fe_create_twiddle(fe_t *fe)

{
  short sVar1;
  short sVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  
  sVar1 = fe->fft_size;
  if (3 < sVar1) {
    lVar3 = 0;
    do {
      dVar4 = ((double)(int)lVar3 * 6.283185307179586) / (double)(int)sVar1;
      dVar5 = cos(dVar4);
      fe->ccc[lVar3] = (frame_t)dVar5;
      dVar4 = sin(dVar4);
      fe->sss[lVar3] = (frame_t)dVar4;
      lVar3 = lVar3 + 1;
      sVar1 = fe->fft_size;
      sVar2 = sVar1 + 3;
      if (-1 < sVar1) {
        sVar2 = sVar1;
      }
    } while (lVar3 < (short)((uint)(int)sVar2 >> 2));
  }
  return;
}

Assistant:

void
fe_create_twiddle(fe_t * fe)
{
    int i;

    for (i = 0; i < fe->fft_size / 4; ++i) {
        float64 a = 2 * M_PI * i / fe->fft_size;
#if defined(FIXED_POINT)
        fe->ccc[i] = FLOAT2COS(cos(a));
        fe->sss[i] = FLOAT2COS(sin(a));
#else
        fe->ccc[i] = cos(a);
        fe->sss[i] = sin(a);
#endif
    }
}